

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_178f1b::allocatePixels
               (int type,Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *uintData,
               Array2D<float_*> *floatData,Array2D<Imath_3_2::half_*> *halfData,int width,int height
               )

{
  Array2D<Imath_3_2::half_*> *in_RCX;
  Array2D<float_*> *in_RDX;
  Array2D<unsigned_int_*> *in_RSI;
  undefined4 in_EDI;
  undefined8 in_R8;
  int unaff_retaddr;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_fffffffffffffff8;
  
  allocatePixels(unaff_retaddr,(Array2D<unsigned_int> *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
                 in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20),in_stack_00000010,
                 in_stack_00000018,(int)halfData);
  return;
}

Assistant:

void
allocatePixels (
    int                     type,
    Array2D<unsigned int>&  sampleCount,
    Array2D<unsigned int*>& uintData,
    Array2D<float*>&        floatData,
    Array2D<half*>&         halfData,
    int                     width,
    int                     height)
{
    allocatePixels (
        type,
        sampleCount,
        uintData,
        floatData,
        halfData,
        0,
        width - 1,
        0,
        height - 1);
}